

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FastEntityStatePdu.cpp
# Opt level: O1

void __thiscall DIS::FastEntityStatePdu::unmarshal(FastEntityStatePdu *this,DataStream *dataStream)

{
  uchar *c;
  pointer *ppVVar1;
  pointer pVVar2;
  pointer pVVar3;
  iterator __position;
  size_t idx;
  long lVar4;
  pointer pVVar5;
  ulong uVar6;
  VariableParameter x;
  VariableParameter local_50;
  
  EntityInformationFamilyPdu::unmarshal(&this->super_EntityInformationFamilyPdu,dataStream);
  DataStream::operator>>
            (dataStream,
             (unsigned_short *)
             &(this->super_EntityInformationFamilyPdu).super_Pdu.super_PduSuperclass.field_0x14);
  DataStream::operator>>
            (dataStream,
             (unsigned_short *)
             &(this->super_EntityInformationFamilyPdu).super_Pdu.super_PduSuperclass.field_0x16);
  DataStream::operator>>(dataStream,&this->_entity);
  DataStream::operator>>(dataStream,&this->_forceId);
  c = &this->_numberOfVariableParameters;
  DataStream::operator>>(dataStream,c);
  DataStream::operator>>(dataStream,&this->_entityKind);
  DataStream::operator>>(dataStream,&this->_domain);
  DataStream::operator>>(dataStream,&this->_country);
  DataStream::operator>>(dataStream,&this->_category);
  DataStream::operator>>(dataStream,&this->_subcategory);
  DataStream::operator>>(dataStream,&this->_specific);
  DataStream::operator>>(dataStream,&this->_extra);
  DataStream::operator>>(dataStream,&this->_altEntityKind);
  DataStream::operator>>(dataStream,&this->_altDomain);
  DataStream::operator>>(dataStream,&this->_altCountry);
  DataStream::operator>>(dataStream,&this->_altCategory);
  DataStream::operator>>(dataStream,&this->_altSubcategory);
  DataStream::operator>>(dataStream,&this->_altSpecific);
  DataStream::operator>>(dataStream,&this->_altExtra);
  DataStream::operator>>(dataStream,&this->_xVelocity);
  DataStream::operator>>(dataStream,&this->_yVelocity);
  DataStream::operator>>(dataStream,&this->_zVelocity);
  DataStream::operator>>(dataStream,&this->_xLocation);
  DataStream::operator>>(dataStream,&this->_yLocation);
  DataStream::operator>>(dataStream,&this->_zLocation);
  DataStream::operator>>(dataStream,&this->_psi);
  DataStream::operator>>(dataStream,&this->_theta);
  DataStream::operator>>(dataStream,&this->_phi);
  DataStream::operator>>(dataStream,&this->_entityAppearance);
  DataStream::operator>>(dataStream,&this->_deadReckoningAlgorithm);
  lVar4 = 0;
  do {
    DataStream::operator>>(dataStream,this->_otherParameters + lVar4);
    lVar4 = lVar4 + 1;
  } while (lVar4 != 0xf);
  DataStream::operator>>(dataStream,&this->_xAcceleration);
  DataStream::operator>>(dataStream,&this->_yAcceleration);
  DataStream::operator>>(dataStream,&this->_zAcceleration);
  DataStream::operator>>(dataStream,&this->_xAngularVelocity);
  DataStream::operator>>(dataStream,&this->_yAngularVelocity);
  DataStream::operator>>(dataStream,&this->_zAngularVelocity);
  lVar4 = 0;
  do {
    DataStream::operator>>(dataStream,this->_marking + lVar4);
    lVar4 = lVar4 + 1;
  } while (lVar4 != 0xc);
  DataStream::operator>>(dataStream,&this->_capabilities);
  pVVar2 = (this->_variableParameters).
           super__Vector_base<DIS::VariableParameter,_std::allocator<DIS::VariableParameter>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pVVar3 = (this->_variableParameters).
           super__Vector_base<DIS::VariableParameter,_std::allocator<DIS::VariableParameter>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  pVVar5 = pVVar2;
  if (pVVar3 != pVVar2) {
    do {
      (**pVVar5->_vptr_VariableParameter)(pVVar5);
      pVVar5 = pVVar5 + 1;
    } while (pVVar5 != pVVar3);
    (this->_variableParameters).
    super__Vector_base<DIS::VariableParameter,_std::allocator<DIS::VariableParameter>_>._M_impl.
    super__Vector_impl_data._M_finish = pVVar2;
  }
  if (*c != '\0') {
    uVar6 = 0;
    do {
      VariableParameter::VariableParameter(&local_50);
      VariableParameter::unmarshal(&local_50,dataStream);
      __position._M_current =
           (this->_variableParameters).
           super__Vector_base<DIS::VariableParameter,_std::allocator<DIS::VariableParameter>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->_variableParameters).
          super__Vector_base<DIS::VariableParameter,_std::allocator<DIS::VariableParameter>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<DIS::VariableParameter,std::allocator<DIS::VariableParameter>>::
        _M_realloc_insert<DIS::VariableParameter_const&>
                  ((vector<DIS::VariableParameter,std::allocator<DIS::VariableParameter>> *)
                   &this->_variableParameters,__position,&local_50);
      }
      else {
        (__position._M_current)->_vptr_VariableParameter =
             (_func_int **)&PTR__VariableParameter_001b6670;
        (__position._M_current)->_recordType = local_50._recordType;
        *(undefined7 *)&(__position._M_current)->field_0x9 = local_50._9_7_;
        (__position._M_current)->_variableParameterFields1 =
             (double)CONCAT17(local_50._variableParameterFields1._7_1_,
                              local_50._variableParameterFields1._0_7_);
        *(ulong *)((long)&(__position._M_current)->_variableParameterFields1 + 7) =
             CONCAT71(local_50._24_7_,local_50._variableParameterFields1._7_1_);
        ppVVar1 = &(this->_variableParameters).
                   super__Vector_base<DIS::VariableParameter,_std::allocator<DIS::VariableParameter>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *ppVVar1 = *ppVVar1 + 1;
      }
      VariableParameter::~VariableParameter(&local_50);
      uVar6 = uVar6 + 1;
    } while (uVar6 < *c);
  }
  return;
}

Assistant:

void FastEntityStatePdu::unmarshal(DataStream& dataStream)
{
    EntityInformationFamilyPdu::unmarshal(dataStream); // unmarshal information in superclass first
    dataStream >> _site;
    dataStream >> _application;
    dataStream >> _entity;
    dataStream >> _forceId;
    dataStream >> _numberOfVariableParameters;
    dataStream >> _entityKind;
    dataStream >> _domain;
    dataStream >> _country;
    dataStream >> _category;
    dataStream >> _subcategory;
    dataStream >> _specific;
    dataStream >> _extra;
    dataStream >> _altEntityKind;
    dataStream >> _altDomain;
    dataStream >> _altCountry;
    dataStream >> _altCategory;
    dataStream >> _altSubcategory;
    dataStream >> _altSpecific;
    dataStream >> _altExtra;
    dataStream >> _xVelocity;
    dataStream >> _yVelocity;
    dataStream >> _zVelocity;
    dataStream >> _xLocation;
    dataStream >> _yLocation;
    dataStream >> _zLocation;
    dataStream >> _psi;
    dataStream >> _theta;
    dataStream >> _phi;
    dataStream >> _entityAppearance;
    dataStream >> _deadReckoningAlgorithm;

     for(size_t idx = 0; idx < 15; idx++)
     {
        dataStream >> _otherParameters[idx];
     }

    dataStream >> _xAcceleration;
    dataStream >> _yAcceleration;
    dataStream >> _zAcceleration;
    dataStream >> _xAngularVelocity;
    dataStream >> _yAngularVelocity;
    dataStream >> _zAngularVelocity;

     for(size_t idx = 0; idx < 12; idx++)
     {
        dataStream >> _marking[idx];
     }

    dataStream >> _capabilities;

     _variableParameters.clear();
     for(size_t idx = 0; idx < _numberOfVariableParameters; idx++)
     {
        VariableParameter x;
        x.unmarshal(dataStream);
        _variableParameters.push_back(x);
     }
}